

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<const_jsoncons::detail::to_integer_result<long,_char>_&>::
streamReconstructedExpression
          (UnaryExpr<const_jsoncons::detail::to_integer_result<long,_char>_&> *this,ostream *os)

{
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)Detail::unprintableString_abi_cxx11_);
  std::operator<<((ostream *)os,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }